

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O2

FindInfo absl::lts_20240722::container_internal::anon_unknown_1::
         FindInsertPositionWithGrowthOrRehash
                   (CommonFields *common,size_t hash,PolicyFunctions *policy)

{
  ulong capacity;
  _func_void_CommonFields_ptr_size_t_HashtablezInfoHandle *p_Var1;
  void *pvVar2;
  ctrl_t *ctrl;
  _func_size_t_void_ptr_void_ptr *p_Var3;
  _func_void_void_ptr_void_ptr_void_ptr *p_Var4;
  ctrl_t cVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  size_t hash_00;
  size_t i;
  void *pvVar9;
  ulong i_00;
  void *pvVar10;
  void *pvVar11;
  FindInfo FVar12;
  HashtablezInfoHandle in_stack_ffffffffffffff58;
  size_t local_88;
  probe_seq<16UL> local_48;
  
  capacity = common->capacity_;
  if ((capacity < 0x11) || (capacity * 0x19 < (common->size_ & 0xffffffffffffffe) * 0x10)) {
    p_Var1 = policy->resize;
    sVar7 = NextCapacity(capacity);
    (*p_Var1)(common,sVar7,in_stack_ffffffffffffff58);
  }
  else {
    if ((capacity + 1 & capacity) != 0) {
      __assert_fail("IsValidCapacity(capacity)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                    ,0xc4,
                    "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
                   );
    }
    pvVar2 = *(void **)((long)&common->heap_or_soo_ + 8);
    ctrl = (common->heap_or_soo_).heap.control;
    ConvertDeletedToEmptyAndFullToDeleted(ctrl,capacity);
    pvVar8 = (*policy->hash_fn)(common);
    sVar7 = policy->slot_size;
    p_Var3 = policy->hash_slot;
    p_Var4 = policy->transfer;
    local_88 = 0xffffffffffffffff;
    pvVar10 = pvVar2;
    for (i_00 = 0; i_00 != capacity; i_00 = i_00 + 1) {
      if (pvVar10 != (void *)(i_00 * sVar7 + (long)pvVar2)) {
        __assert_fail("slot_ptr == SlotAddress(slot_array, i, slot_size)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                      ,0xe7,
                      "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
                     );
      }
      sVar6 = i_00;
      if ((ctrl[i_00] != kEmpty) && (sVar6 = local_88, ctrl[i_00] == kDeleted)) {
        hash_00 = (*p_Var3)(pvVar8,pvVar10);
        FVar12 = find_first_non_full<void>(common,hash_00);
        i = FVar12.offset;
        probe(&local_48,common,hash_00);
        cVar5 = (ctrl_t)hash_00;
        if (((i_00 - local_48.offset_ ^ i - local_48.offset_) & capacity) < 0x10) {
          SetCtrl(common,i_00,cVar5 & ~kEmpty,sVar7);
        }
        else {
          pvVar9 = (void *)(i * sVar7 + (long)pvVar2);
          if (ctrl[i] == kDeleted) {
            SetCtrl(common,i,cVar5 & ~kEmpty,sVar7);
            if (local_88 == 0xffffffffffffffff) {
              do {
                i_00 = i_00 + 1;
              } while (i_00 < capacity);
              __assert_fail("false && \"no empty slot\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                            ,0xbb,
                            "size_t absl::container_internal::(anonymous namespace)::FindEmptySlot(size_t, size_t, const ctrl_t *)"
                           );
            }
            pvVar11 = (void *)(local_88 * sVar7 + (long)pvVar2);
            (*p_Var4)(common,pvVar11,pvVar9);
            (*p_Var4)(common,pvVar9,pvVar10);
            (*p_Var4)(common,pvVar10,pvVar11);
            i_00 = i_00 - 1;
            pvVar10 = (void *)((long)pvVar10 - sVar7);
          }
          else {
            if (ctrl[i] != kEmpty) {
              __assert_fail("IsDeleted(ctrl[new_i])",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                            ,0x10b,
                            "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
                           );
            }
            SetCtrl(common,i,cVar5 & ~kEmpty,sVar7);
            (*p_Var4)(common,pvVar9,pvVar10);
            SetCtrl(common,i_00,kEmpty,sVar7);
            sVar6 = i_00;
          }
        }
      }
      local_88 = sVar6;
      pvVar10 = (void *)((long)pvVar10 + sVar7);
    }
    ResetGrowthLeft(common);
    CommonFields::infoz(common);
  }
  FVar12 = find_first_non_full<void>(common,hash);
  return FVar12;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE
FindInfo FindInsertPositionWithGrowthOrRehash(CommonFields& common, size_t hash,
                                              const PolicyFunctions& policy) {
  const size_t cap = common.capacity();
  if (cap > Group::kWidth &&
      // Do these calculations in 64-bit to avoid overflow.
      common.size() * uint64_t{32} <= cap * uint64_t{25}) {
    // Squash DELETED without growing if there is enough capacity.
    //
    // Rehash in place if the current size is <= 25/32 of capacity.
    // Rationale for such a high factor: 1) DropDeletesWithoutResize() is
    // faster than resize, and 2) it takes quite a bit of work to add
    // tombstones.  In the worst case, seems to take approximately 4
    // insert/erase pairs to create a single tombstone and so if we are
    // rehashing because of tombstones, we can afford to rehash-in-place as
    // long as we are reclaiming at least 1/8 the capacity without doing more
    // than 2X the work.  (Where "work" is defined to be size() for rehashing
    // or rehashing in place, and 1 for an insert or erase.)  But rehashing in
    // place is faster per operation than inserting or even doubling the size
    // of the table, so we actually afford to reclaim even less space from a
    // resize-in-place.  The decision is to rehash in place if we can reclaim
    // at about 1/8th of the usable capacity (specifically 3/28 of the
    // capacity) which means that the total cost of rehashing will be a small
    // fraction of the total work.
    //
    // Here is output of an experiment using the BM_CacheInSteadyState
    // benchmark running the old case (where we rehash-in-place only if we can
    // reclaim at least 7/16*capacity) vs. this code (which rehashes in place
    // if we can recover 3/32*capacity).
    //
    // Note that although in the worst-case number of rehashes jumped up from
    // 15 to 190, but the number of operations per second is almost the same.
    //
    // Abridged output of running BM_CacheInSteadyState benchmark from
    // raw_hash_set_benchmark.   N is the number of insert/erase operations.
    //
    //      | OLD (recover >= 7/16        | NEW (recover >= 3/32)
    // size |    N/s LoadFactor NRehashes |    N/s LoadFactor NRehashes
    //  448 | 145284       0.44        18 | 140118       0.44        19
    //  493 | 152546       0.24        11 | 151417       0.48        28
    //  538 | 151439       0.26        11 | 151152       0.53        38
    //  583 | 151765       0.28        11 | 150572       0.57        50
    //  628 | 150241       0.31        11 | 150853       0.61        66
    //  672 | 149602       0.33        12 | 150110       0.66        90
    //  717 | 149998       0.35        12 | 149531       0.70       129
    //  762 | 149836       0.37        13 | 148559       0.74       190
    //  807 | 149736       0.39        14 | 151107       0.39        14
    //  852 | 150204       0.42        15 | 151019       0.42        15
    DropDeletesWithoutResize(common, policy);
  } else {
    // Otherwise grow the container.
    policy.resize(common, NextCapacity(cap), HashtablezInfoHandle{});
  }
  // This function is typically called with tables containing deleted slots.
  // The table will be big and `FindFirstNonFullAfterResize` will always
  // fallback to `find_first_non_full`. So using `find_first_non_full` directly.
  return find_first_non_full(common, hash);
}